

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void NOPN2_Reset(ym3438_t *chip,Bit32u clock,Bit32u rate)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  memset(chip,0,0x8548);
  chip->clock = clock;
  chip->smplRate = rate;
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 1) {
    (chip->eg_kon + lVar2 * 2)[0] = 0xff;
    (chip->eg_kon + lVar2 * 2)[1] = '\x03';
    chip->eg_out[lVar2] = 0x3ff;
    *(undefined1 *)((long)chip->eg_level + lVar2) = 3;
    chip->sl[lVar2] = '\x01';
  }
  for (lVar2 = -6; lVar2 != 0; lVar2 = lVar2 + 1) {
    chip->pan_r[lVar2] = '\x01';
    chip->ams[lVar2] = '\x01';
  }
  iVar1 = (int)(((ulong)rate * 0x24000) / (ulong)clock);
  uVar3 = iVar1 - 0x400;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  iVar4 = 0x400;
  if (1 < uVar5) {
    iVar4 = iVar1;
  }
  chip->rateratio = iVar4;
  return;
}

Assistant:

void NOPN2_Reset(ym3438_t *chip, Bit32u clock, Bit32u rate)
{
    Bit32u i;
    memset(chip, 0, sizeof(ym3438_t));
    chip->clock = clock;
    chip->smplRate = rate;
    for (i = 0; i < 24; i++)
    {
        chip->eg_out[i] = 0x3ff;
        chip->eg_level[i] = 0x3ff;
        chip->eg_state[i] = eg_num_release;
        chip->multi[i] = 1;
    }
    for (i = 0; i < 6; i++)
    {
        chip->pan_l[i] = 1;
        chip->pan_r[i] = 1;
    }
    // ratio: sampleRate / (clock / 144) * (1 << resamplerFraction)
    chip->rateratio = (Bit32s)((((Bit64u)144 * chip->smplRate) << RSM_FRAC) / chip->clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
}